

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_test.cpp
# Opt level: O1

void __thiscall FFT_Multiplies_Test::TestBody(FFT_Multiplies_Test *this)

{
  pointer *__a;
  pointer *__return_storage_ptr__;
  pointer *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  char *message;
  ulong uVar4;
  undefined1 local_a8 [8];
  vector<long_long,_std::allocator<long_long>_> want;
  undefined1 local_88 [8];
  vector<long_long,_std::allocator<long_long>_> p1;
  vector<long_long,_std::allocator<long_long>_> p2;
  internal local_40 [8];
  AssertionResult gtest_ar;
  
  iVar3 = 0;
  __a = &p1.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
  __return_storage_ptr__ =
       &p2.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage;
  do {
    iVar2 = rand();
    std::vector<long_long,_std::allocator<long_long>_>::vector
              ((vector<long_long,_std::allocator<long_long>_> *)local_88,
               (ulong)(iVar2 % 0x1e + 0x1e),(allocator_type *)__a);
    iVar2 = rand();
    std::vector<long_long,_std::allocator<long_long>_>::vector
              ((vector<long_long,_std::allocator<long_long>_> *)__a,(ulong)(iVar2 % 0x1e + 0x1e),
               (allocator_type *)local_a8);
    if ((undefined1  [8])
        p1.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
        ._M_start != local_88) {
      uVar4 = 0;
      do {
        iVar2 = rand();
        *(long *)((long)local_88 + uVar4 * 8) = (long)(iVar2 % 20000000 + -10000000);
        uVar4 = uVar4 + 1;
      } while (uVar4 < (ulong)((long)p1.super__Vector_base<long_long,_std::allocator<long_long>_>.
                                     _M_impl.super__Vector_impl_data._M_start - (long)local_88 >> 3)
              );
    }
    if (p2.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
        ._M_start !=
        p1.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage) {
      uVar4 = 0;
      do {
        iVar2 = rand();
        p1.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage[uVar4] = (long)(iVar2 % 20000000 + -10000000);
        uVar4 = uVar4 + 1;
      } while (uVar4 < (ulong)((long)p2.super__Vector_base<long_long,_std::allocator<long_long>_>.
                                     _M_impl.super__Vector_impl_data._M_start -
                               (long)p1.super__Vector_base<long_long,_std::allocator<long_long>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage >> 3));
    }
    multiplyNaive((vector<long_long,_std::allocator<long_long>_> *)local_a8,
                  (vector<long_long,_std::allocator<long_long>_> *)local_88,
                  (vector<long_long,_std::allocator<long_long>_> *)__a);
    multiplyPolynomials((vector<long_long,_std::allocator<long_long>_> *)__return_storage_ptr__,
                        (vector<long_long,_std::allocator<long_long>_> *)local_88,
                        (vector<long_long,_std::allocator<long_long>_> *)__a);
    testing::internal::
    CmpHelperEQ<std::vector<long_long,std::allocator<long_long>>,std::vector<long_long,std::allocator<long_long>>>
              (local_40,"want","multiplyPolynomials(p1, p2)",
               (vector<long_long,_std::allocator<long_long>_> *)local_a8,
               (vector<long_long,_std::allocator<long_long>_> *)__return_storage_ptr__);
    if (p2.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage != (pointer)0x0) {
      operator_delete(p2.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    }
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)__return_storage_ptr__);
      message = "";
      if (gtest_ar._0_8_ != 0) {
        message = *(char **)gtest_ar._0_8_;
      }
      this_00 = &want.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_00,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/numerical/fft_test.cpp"
                 ,0x36,message);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,(Message *)__return_storage_ptr__);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
      if (p2.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (p2.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage != (pointer)0x0)) {
          (**(code **)(*p2.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 8))();
        }
        p2.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_a8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_a8);
    }
    if (p1.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage != (pointer)0x0) {
      operator_delete(p1.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    }
    if (local_88 != (undefined1  [8])0x0) {
      operator_delete((void *)local_88);
    }
    iVar3 = iVar3 + 1;
  } while (iVar3 != 0x1e);
  return;
}

Assistant:

TEST(FFT, Multiplies) {
    rep(i, 0, 30) {
        vector<ll> p1(30 + rand() % 30), p2(30 + rand() % 30);
        rep(j, 0, p1.size()) p1[j] = rand() % 20000000 - 10000000;
        rep(j, 0, p2.size()) p2[j] = rand() % 20000000 - 10000000;
        vector<ll> want = multiplyNaive(p1, p2);
        EXPECT_EQ(want, multiplyPolynomials(p1, p2));
    }
}